

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall fmt::v7::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  size_t sVar1;
  uint *puVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint *puVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  
  sVar1 = (other->bigits_).super_buffer<unsigned_int>.size_;
  if (sVar1 != 0) {
    iVar3 = other->exp_ - this->exp_;
    puVar6 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    sVar7 = 0;
    lVar9 = 0;
    do {
      uVar11 = iVar3 + (int)sVar7;
      lVar10 = (ulong)puVar2[uVar11] + (lVar9 - (ulong)puVar6[sVar7]);
      puVar2[uVar11] = (uint)lVar10;
      lVar9 = lVar10 >> 0x3f;
      sVar7 = sVar7 + 1;
    } while (sVar1 != sVar7);
    if (lVar10 < 0) {
      uVar11 = iVar3 + (int)sVar7;
      puVar6 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      uVar8 = (ulong)puVar6[uVar11];
      lVar9 = -1;
      do {
        uVar8 = (uVar8 & 0xffffffff) + lVar9;
        lVar9 = (long)uVar8 >> 0x3f;
      } while ((long)uVar8 < 0);
      puVar6[uVar11] = (uint)uVar8;
      remove_leading_zeros(this);
      return;
    }
  }
  uVar8 = (this->bigits_).super_buffer<unsigned_int>.size_;
  uVar5 = 1;
  if ((int)uVar8 < 1) {
    uVar5 = uVar8 & 0xffffffff;
  }
  puVar6 = (this->bigits_).super_buffer<unsigned_int>.ptr_ + (uVar8 & 0xffffffff);
  do {
    uVar4 = uVar8;
    puVar6 = puVar6 + -1;
    iVar3 = (int)uVar4;
    if (iVar3 < 2) goto LAB_001173bf;
    uVar8 = (ulong)(iVar3 - 1);
  } while (*puVar6 == 0);
  uVar5 = uVar4 & 0xffffffff;
LAB_001173bf:
  uVar8 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar8 < uVar5) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar5);
    uVar8 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  }
  if (uVar8 < uVar5) {
    uVar5 = uVar8;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar5;
  return;
}

Assistant:

size_t size() const FMT_NOEXCEPT { return size_; }